

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3pBufferDataUploadTests.cpp
# Opt level: O1

void __thiscall
deqp::gles3::Performance::anon_unknown_1::
RenderCase<deqp::gles3::Performance::(anonymous_namespace)::RenderReadDuration>::logAndSetTestResult
          (RenderCase<deqp::gles3::Performance::(anonymous_namespace)::RenderReadDuration> *this,
          vector<deqp::gles3::Performance::(anonymous_namespace)::RenderCase<deqp::gles3::Performance::(anonymous_namespace)::RenderReadDuration>::SampleResult,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::RenderCase<deqp::gles3::Performance::(anonymous_namespace)::RenderReadDuration>::SampleResult>_>
          *results)

{
  deUint64 *pdVar1;
  TestContext *this_00;
  undefined8 uVar2;
  undefined8 uVar3;
  deUint64 dVar4;
  deUint64 dVar5;
  deUint64 dVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  long lVar10;
  pointer pRVar11;
  long lVar12;
  pointer pSVar13;
  int precision;
  undefined8 *puVar14;
  void *pvVar15;
  ulong uVar16;
  RenderSampleAnalyzeResult RVar17;
  vector<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::RenderReadDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::RenderReadDuration>_>_>
  mappedResults;
  vector<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::RenderReadDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::RenderReadDuration>_>_>
  local_88;
  string local_70;
  void *local_50;
  long local_48;
  ulong local_40;
  RenderCase<deqp::gles3::Performance::(anonymous_namespace)::RenderReadDuration> *local_38;
  
  local_88.
  super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::RenderReadDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::RenderReadDuration>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_88.
  super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::RenderReadDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::RenderReadDuration>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_88.
  super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::RenderReadDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::RenderReadDuration>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  lVar10 = (long)(results->
                 super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::RenderCase<deqp::gles3::Performance::(anonymous_namespace)::RenderReadDuration>::SampleResult,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::RenderCase<deqp::gles3::Performance::(anonymous_namespace)::RenderReadDuration>::SampleResult>_>
                 )._M_impl.super__Vector_impl_data._M_finish -
           (long)(results->
                 super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::RenderCase<deqp::gles3::Performance::(anonymous_namespace)::RenderReadDuration>::SampleResult,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::RenderCase<deqp::gles3::Performance::(anonymous_namespace)::RenderReadDuration>::SampleResult>_>
                 )._M_impl.super__Vector_impl_data._M_start >> 3;
  uVar16 = lVar10 * -0x71c71c71c71c71c7;
  pvVar15 = (void *)0x0;
  if (uVar16 != 0) {
    if (uVar16 == 0) {
      uRam0000000000000020 = 0;
      uRam0000000000000028 = 0;
      uRam0000000000000010 = 0;
      uRam0000000000000018 = 0;
      uRam0000000000000000 = 0;
      uRam0000000000000008 = 0;
      _DAT_00000030 = 0;
      local_88.
      super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::RenderReadDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::RenderReadDuration>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)(lVar10 * 0x1c71c71c71c71c78);
      puVar14 = (undefined8 *)&DAT_00000038;
      do {
        puVar14[6] = _DAT_00000030;
        uVar9 = uRam0000000000000028;
        uVar8 = uRam0000000000000018;
        uVar7 = uRam0000000000000010;
        uVar3 = uRam0000000000000008;
        uVar2 = uRam0000000000000000;
        puVar14[4] = uRam0000000000000020;
        puVar14[5] = uVar9;
        puVar14[2] = uVar7;
        puVar14[3] = uVar8;
        *puVar14 = uVar2;
        puVar14[1] = uVar3;
        puVar14 = puVar14 + 7;
      } while ((undefined8 *)(lVar10 * 0x1c71c71c71c71c78) != puVar14);
    }
    else {
      if (0x249249249249249 < uVar16) {
        std::__throw_length_error("vector::_M_default_append");
      }
      local_48 = 0;
      local_40 = uVar16;
      if (uVar16 == 0 && lVar10 * 0x71c71c71c71c71c7 != 0) {
        local_40 = 0;
      }
      if (0x249249249249248 < local_40) {
        local_40 = 0x249249249249249;
      }
      local_38 = this;
      if (local_40 == 0) {
        pRVar11 = (pointer)0x0;
      }
      else {
        local_50 = (void *)0x0;
        pRVar11 = (pointer)operator_new(local_40 * 0x38);
        pvVar15 = local_50;
      }
      (pRVar11->duration).renderReadDuration = 0;
      (pRVar11->duration).totalDuration = 0;
      (pRVar11->duration).renderDuration = 0;
      (pRVar11->duration).readDuration = 0;
      pRVar11->uploadedDataSize = 0;
      pRVar11->renderDataSize = 0;
      pRVar11->unrelatedDataSize = 0;
      pRVar11->numVertices = 0;
      (pRVar11->duration).fitResponseDuration = 0;
      if ((uVar16 - 1 != 0) && ((uVar16 - 1) * 0x38 != 0)) {
        lVar12 = 0x38;
        do {
          *(deUint64 *)((long)&(pRVar11->duration).fitResponseDuration + lVar12) =
               (pRVar11->duration).fitResponseDuration;
          uVar2 = *(undefined8 *)pRVar11;
          uVar3 = *(undefined8 *)&pRVar11->unrelatedDataSize;
          dVar4 = (pRVar11->duration).renderDuration;
          dVar5 = (pRVar11->duration).readDuration;
          dVar6 = (pRVar11->duration).totalDuration;
          pdVar1 = (deUint64 *)((long)&(pRVar11->duration).renderReadDuration + lVar12);
          *pdVar1 = (pRVar11->duration).renderReadDuration;
          pdVar1[1] = dVar6;
          pdVar1 = (deUint64 *)((long)&(pRVar11->duration).renderDuration + lVar12);
          *pdVar1 = dVar4;
          pdVar1[1] = dVar5;
          puVar14 = (undefined8 *)((long)&pRVar11->uploadedDataSize + lVar12);
          *puVar14 = uVar2;
          puVar14[1] = uVar3;
          lVar12 = lVar12 + 0x38;
        } while (lVar10 * 0x1c71c71c71c71c78 - lVar12 != 0);
      }
      if (pvVar15 != (void *)0x0) {
        operator_delete(pvVar15,local_48 - (long)pvVar15);
      }
      local_88.
      super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::RenderReadDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::RenderReadDuration>_>_>
      ._M_impl.super__Vector_impl_data._M_finish =
           (pointer)(lVar10 * 0x1c71c71c71c71c78 + (long)pRVar11);
      local_88.
      super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::RenderReadDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::RenderReadDuration>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = pRVar11 + local_40;
      this = local_38;
      local_88.
      super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::RenderReadDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::RenderReadDuration>_>_>
      ._M_impl.super__Vector_impl_data._M_start = pRVar11;
    }
  }
  pSVar13 = (results->
            super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::RenderCase<deqp::gles3::Performance::(anonymous_namespace)::RenderReadDuration>::SampleResult,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::RenderCase<deqp::gles3::Performance::(anonymous_namespace)::RenderReadDuration>::SampleResult>_>
            )._M_impl.super__Vector_impl_data._M_start;
  if (0 < (int)((ulong)((long)(results->
                              super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::RenderCase<deqp::gles3::Performance::(anonymous_namespace)::RenderReadDuration>::SampleResult,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::RenderCase<deqp::gles3::Performance::(anonymous_namespace)::RenderReadDuration>::SampleResult>_>
                              )._M_impl.super__Vector_impl_data._M_finish - (long)pSVar13) >> 3) *
          0x38e38e39) {
    lVar10 = 0x10;
    lVar12 = 0;
    pRVar11 = local_88.
              super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::RenderReadDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::RenderReadDuration>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    do {
      (pRVar11->duration).fitResponseDuration =
           *(deUint64 *)((long)&(pSVar13->result).duration.renderReadDuration + lVar10);
      puVar14 = (undefined8 *)((long)&(pSVar13->scene).gridWidth + lVar10);
      uVar2 = *puVar14;
      uVar3 = puVar14[1];
      pdVar1 = (deUint64 *)((long)&(pSVar13->result).uploadedDataSize + lVar10);
      dVar4 = *pdVar1;
      dVar5 = pdVar1[1];
      pdVar1 = (deUint64 *)((long)&(pSVar13->result).duration.renderDuration + lVar10);
      dVar6 = pdVar1[1];
      (pRVar11->duration).renderReadDuration = *pdVar1;
      (pRVar11->duration).totalDuration = dVar6;
      (pRVar11->duration).renderDuration = dVar4;
      (pRVar11->duration).readDuration = dVar5;
      pRVar11->uploadedDataSize = (int)uVar2;
      pRVar11->renderDataSize = (int)((ulong)uVar2 >> 0x20);
      pRVar11->unrelatedDataSize = (int)uVar3;
      pRVar11->numVertices = (int)((ulong)uVar3 >> 0x20);
      lVar12 = lVar12 + 1;
      pSVar13 = (results->
                super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::RenderCase<deqp::gles3::Performance::(anonymous_namespace)::RenderReadDuration>::SampleResult,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::RenderCase<deqp::gles3::Performance::(anonymous_namespace)::RenderReadDuration>::SampleResult>_>
                )._M_impl.super__Vector_impl_data._M_start;
      pRVar11 = pRVar11 + 1;
      lVar10 = lVar10 + 0x48;
    } while (lVar12 < (int)((ulong)((long)(results->
                                          super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::RenderCase<deqp::gles3::Performance::(anonymous_namespace)::RenderReadDuration>::SampleResult,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::RenderCase<deqp::gles3::Performance::(anonymous_namespace)::RenderReadDuration>::SampleResult>_>
                                          )._M_impl.super__Vector_impl_data._M_finish -
                                   (long)pSVar13) >> 3) * 0x38e38e39);
  }
  RVar17 = analyzeSampleResults<deqp::gles3::Performance::(anonymous_namespace)::RenderReadDuration>
                     (((this->super_RenderPerformanceTestBase).super_TestCase.super_TestCase.
                       super_TestNode.m_testCtx)->m_log,&local_88);
  this_00 = (this->super_RenderPerformanceTestBase).super_TestCase.super_TestCase.super_TestNode.
            m_testCtx;
  if (RVar17.renderRateAtRange < INFINITY) {
    de::floatToString_abi_cxx11_
              (&local_70,(de *)0x2,RVar17.renderRateAtRange * 0.0009765625 * 0.0009765625,precision)
    ;
    tcu::TestContext::setTestResult(this_00,QP_TEST_RESULT_PASS,local_70._M_dataplus._M_p);
  }
  else {
    de::floatToString_abi_cxx11_(&local_70,(de *)0x2,0.0,precision);
    tcu::TestContext::setTestResult(this_00,QP_TEST_RESULT_PASS,local_70._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  if (local_88.
      super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::RenderReadDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::RenderReadDuration>_>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_88.
                    super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::RenderReadDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::RenderReadDuration>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_88.
                          super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::RenderReadDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::RenderReadDuration>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_88.
                          super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::RenderReadDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::RenderReadDuration>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void RenderCase<SampleType>::logAndSetTestResult (const std::vector<SampleResult>& results)
{
	std::vector<RenderSampleResult<SampleType> > mappedResults;

	mapResultsToRenderRateFormat(mappedResults, results);

	{
		const RenderSampleAnalyzeResult	analysis	= analyzeSampleResults(m_testCtx.getLog(), mappedResults);
		const float						rate		= analysis.renderRateAtRange;

		if (rate == std::numeric_limits<float>::infinity())
		{
			// sample times are 1) invalid or 2) timer resolution too low
			m_testCtx.setTestResult(QP_TEST_RESULT_PASS, de::floatToString(0.0f, 2).c_str());
		}
		else
		{
			// report transfer rate in millions of MiB/s
			m_testCtx.setTestResult(QP_TEST_RESULT_PASS, de::floatToString(rate / 1024.0f / 1024.0f, 2).c_str());
		}
	}
}